

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall fasttext::BinaryLogisticLoss::computeOutput(BinaryLogisticLoss *this,State *state)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  Vector::mul(&state->output,
              (((this->super_Loss).wo_)->
              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &state->hidden);
  pfVar2 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(state->output).data_.
                               super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar2) >> 2);
  if (0 < (int)uVar4) {
    pfVar3 = (this->super_Loss).t_sigmoid_.super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      fVar1 = pfVar2[uVar5];
      fVar6 = 0.0;
      if ((-8.0 <= fVar1) && (fVar6 = 1.0, fVar1 <= 8.0)) {
        fVar6 = pfVar3[(long)((fVar1 + 8.0) * 512.0 * 0.125 * 0.5)];
      }
      pfVar2[uVar5] = fVar6;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  return;
}

Assistant:

void BinaryLogisticLoss::computeOutput(Model::State& state) const {
  Vector& output = state.output;
  output.mul(*wo_, state.hidden);
  int32_t osz = output.size();
  for (int32_t i = 0; i < osz; i++) {
    output[i] = sigmoid(output[i]);
  }
}